

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::TraverseSchema::traverseIdentityConstraint
          (TraverseSchema *this,IdentityConstraint *ic,DOMElement *icElem)

{
  XMLStringPool *pXVar1;
  SchemaGrammar *this_00;
  SchemaInfo *pSVar2;
  bool bVar3;
  int iVar4;
  DOMElement *pDVar5;
  DOMNode *parent;
  undefined4 extraout_var;
  XSAnnotation *pXVar6;
  XMLCh *pXVar7;
  XMLSize_t XVar8;
  XercesXPath *pXVar9;
  NamespaceScope *pNVar10;
  IC_Selector *this_01;
  undefined4 extraout_var_00;
  IC_Field *this_02;
  XPathException *e_1;
  IC_Field *icField;
  XercesXPath *fieldXPath;
  XPathException *e;
  IC_Selector *icSelector;
  XercesXPath *sXPath;
  XMLSize_t xpathLen;
  XMLCh *xpathExpr;
  Janitor<xercesc_4_0::XSAnnotation> local_58;
  Janitor<xercesc_4_0::XSAnnotation> janAnnot;
  DOMNode *local_40;
  DOMElement *elem;
  NamespaceScopeManager nsMgr;
  DOMElement *icElem_local;
  IdentityConstraint *ic_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)icElem;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&elem,icElem,this->fSchemaInfo,this);
  pSVar2 = nsMgr.fSchemaInfo;
  pDVar5 = XUtil::getFirstChildElement((DOMNode *)nsMgr.fSchemaInfo);
  parent = &checkContent(this,(DOMElement *)pSVar2,pDVar5,false,true)->super_DOMNode;
  bVar3 = XMLScanner::getGenerateSyntheticAnnotations(this->fScanner);
  if (((bVar3) && (this->fAnnotation == (XSAnnotation *)0x0)) &&
     (XVar8 = ValueVectorOf<xercesc_4_0::DOMNode_*>::size(this->fNonXSAttList), XVar8 != 0)) {
    pXVar6 = generateSyntheticAnnotation(this,(DOMElement *)nsMgr.fSchemaInfo,this->fNonXSAttList);
    this->fAnnotation = pXVar6;
  }
  Janitor<xercesc_4_0::XSAnnotation>::Janitor(&local_58,this->fAnnotation);
  if (parent == (DOMNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar4 = (*parent->_vptr_DOMNode[0x18])();
    bVar3 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar4),
                              (XMLCh *)SchemaSymbols::fgELT_SELECTOR);
    if (bVar3) {
      GeneralAttributeCheck::checkAttributes
                (&this->fAttributeCheck,(DOMElement *)parent,0x29,this,false,this->fNonXSAttList);
      pSVar2 = nsMgr.fSchemaInfo;
      pDVar5 = XUtil::getFirstChildElement(parent);
      pDVar5 = checkContent(this,(DOMElement *)pSVar2,pDVar5,true,true);
      if (pDVar5 != (DOMElement *)0x0) {
        reportSchemaError(this,(DOMElement *)parent,(XMLCh *)XMLUni::fgXMLErrDomain,0x4d);
      }
      bVar3 = XMLScanner::getGenerateSyntheticAnnotations(this->fScanner);
      if (((bVar3) && (this->fAnnotation == (XSAnnotation *)0x0)) &&
         (XVar8 = ValueVectorOf<xercesc_4_0::DOMNode_*>::size(this->fNonXSAttList), XVar8 != 0)) {
        pXVar6 = generateSyntheticAnnotation(this,(DOMElement *)parent,this->fNonXSAttList);
        this->fAnnotation = pXVar6;
      }
      if (this->fAnnotation != (XSAnnotation *)0x0) {
        bVar3 = Janitor<xercesc_4_0::XSAnnotation>::isDataNull(&local_58);
        if (bVar3) {
          Janitor<xercesc_4_0::XSAnnotation>::reset(&local_58,this->fAnnotation);
        }
        else {
          pXVar6 = Janitor<xercesc_4_0::XSAnnotation>::get(&local_58);
          XSAnnotation::setNext(pXVar6,this->fAnnotation);
        }
      }
      pXVar7 = getElementAttValue(this,(DOMElement *)parent,(XMLCh *)SchemaSymbols::fgATT_XPATH,
                                  UnKnown);
      XVar8 = XMLString::stringLen(pXVar7);
      if ((pXVar7 == (XMLCh *)0x0) || (XVar8 == 0)) {
        reportSchemaError(this,(DOMElement *)parent,(XMLCh *)XMLUni::fgXMLErrDomain,0x86);
        this_local._7_1_ = false;
      }
      else {
        pXVar9 = (XercesXPath *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
        pXVar1 = this->fStringPool;
        pNVar10 = SchemaInfo::getNamespaceScope(this->fSchemaInfo);
        XercesXPath::XercesXPath
                  (pXVar9,pXVar7,pXVar1,&pNVar10->super_XercesNamespaceResolver,
                   this->fEmptyNamespaceURI,true,this->fGrammarPoolMemoryManager);
        this_01 = (IC_Selector *)XMemory::operator_new(0x18,this->fGrammarPoolMemoryManager);
        IC_Selector::IC_Selector(this_01,pXVar9,ic);
        IdentityConstraint::setSelector(ic,this_01);
        local_40 = &XUtil::getNextSiblingElement(parent)->super_DOMNode;
        if (local_40 == (DOMNode *)0x0) {
          reportSchemaError(this,(DOMElement *)nsMgr.fSchemaInfo,(XMLCh *)XMLUni::fgXMLErrDomain,
                            0x83);
          this_local._7_1_ = false;
        }
        else {
          for (; local_40 != (DOMNode *)0x0;
              local_40 = &XUtil::getNextSiblingElement(local_40)->super_DOMNode) {
            iVar4 = (*local_40->_vptr_DOMNode[0x18])();
            bVar3 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar4),
                                      (XMLCh *)SchemaSymbols::fgELT_FIELD);
            if (bVar3) {
              GeneralAttributeCheck::checkAttributes
                        (&this->fAttributeCheck,(DOMElement *)local_40,0x14,this,false,
                         this->fNonXSAttList);
              pSVar2 = nsMgr.fSchemaInfo;
              pDVar5 = XUtil::getFirstChildElement(local_40);
              pDVar5 = checkContent(this,(DOMElement *)pSVar2,pDVar5,true,true);
              if (pDVar5 != (DOMElement *)0x0) {
                reportSchemaError(this,(DOMElement *)local_40,(XMLCh *)XMLUni::fgXMLErrDomain,0x4d);
              }
              bVar3 = XMLScanner::getGenerateSyntheticAnnotations(this->fScanner);
              if (((bVar3) && (this->fAnnotation == (XSAnnotation *)0x0)) &&
                 (XVar8 = ValueVectorOf<xercesc_4_0::DOMNode_*>::size(this->fNonXSAttList),
                 XVar8 != 0)) {
                pXVar6 = generateSyntheticAnnotation
                                   (this,(DOMElement *)local_40,this->fNonXSAttList);
                this->fAnnotation = pXVar6;
              }
              if (this->fAnnotation != (XSAnnotation *)0x0) {
                bVar3 = Janitor<xercesc_4_0::XSAnnotation>::isDataNull(&local_58);
                if (bVar3) {
                  Janitor<xercesc_4_0::XSAnnotation>::reset(&local_58,this->fAnnotation);
                }
                else {
                  pXVar6 = Janitor<xercesc_4_0::XSAnnotation>::get(&local_58);
                  XSAnnotation::setNext(pXVar6,this->fAnnotation);
                }
              }
              pXVar7 = getElementAttValue(this,(DOMElement *)local_40,
                                          (XMLCh *)SchemaSymbols::fgATT_XPATH,UnKnown);
              if ((pXVar7 == (XMLCh *)0x0) || (*pXVar7 == L'\0')) {
                reportSchemaError(this,(DOMElement *)local_40,(XMLCh *)XMLUni::fgXMLErrDomain,0x86);
                this_local._7_1_ = false;
                goto LAB_0043d8c8;
              }
              pXVar9 = (XercesXPath *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
              pXVar1 = this->fStringPool;
              pNVar10 = SchemaInfo::getNamespaceScope(this->fSchemaInfo);
              XercesXPath::XercesXPath
                        (pXVar9,pXVar7,pXVar1,&pNVar10->super_XercesNamespaceResolver,
                         this->fEmptyNamespaceURI,false,this->fGrammarPoolMemoryManager);
              this_02 = (IC_Field *)XMemory::operator_new(0x18,this->fGrammarPoolMemoryManager);
              IC_Field::IC_Field(this_02,pXVar9,ic);
              IdentityConstraint::addField(ic,this_02);
            }
            else {
              reportSchemaError(this,(DOMElement *)local_40,(XMLCh *)XMLUni::fgXMLErrDomain,0x83);
            }
          }
          bVar3 = Janitor<xercesc_4_0::XSAnnotation>::isDataNull(&local_58);
          if (!bVar3) {
            this_00 = this->fSchemaGrammar;
            pXVar6 = Janitor<xercesc_4_0::XSAnnotation>::release(&local_58);
            SchemaGrammar::putAnnotation(this_00,ic,pXVar6);
          }
          XVar8 = IdentityConstraint::getFieldCount(ic);
          if (XVar8 == 0) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
    }
    else {
      reportSchemaError(this,(DOMElement *)parent,(XMLCh *)XMLUni::fgXMLErrDomain,0x83);
      this_local._7_1_ = false;
    }
  }
LAB_0043d8c8:
  Janitor<xercesc_4_0::XSAnnotation>::~Janitor(&local_58);
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&elem);
  return this_local._7_1_;
}

Assistant:

bool TraverseSchema::traverseIdentityConstraint(IdentityConstraint* const ic,
                                                const DOMElement* const icElem) {

    NamespaceScopeManager nsMgr(icElem, fSchemaInfo, this);

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration
    // ------------------------------------------------------------------
    DOMElement* elem = checkContent(icElem, XUtil::getFirstChildElement(icElem), false);
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(icElem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // ------------------------------------------------------------------
    // Get selector
    // ------------------------------------------------------------------
    if (elem == 0) {

//        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    if (!XMLString::equals(elem->getLocalName(), SchemaSymbols::fgELT_SELECTOR)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_Selector, this, false, fNonXSAttList
    );
    if (checkContent(icElem, XUtil::getFirstChildElement(elem), true) != 0)
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    if (fAnnotation)
    {
        if (janAnnot.isDataNull())
            janAnnot.reset(fAnnotation);
        else
            janAnnot.get()->setNext(fAnnotation);
    }

    // ------------------------------------------------------------------
    // Get xpath attribute
    // ------------------------------------------------------------------
    const XMLCh* xpathExpr = getElementAttValue(elem, SchemaSymbols::fgATT_XPATH);
    XMLSize_t    xpathLen = XMLString::stringLen(xpathExpr);

    if (!xpathExpr || !xpathLen) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_XPathExprMissing);
        return false;
    }

    // ------------------------------------------------------------------
    // Parse xpath expression
    // ------------------------------------------------------------------
    try {

        XercesXPath* sXPath = new (fGrammarPoolMemoryManager) XercesXPath(xpathExpr, fStringPool, fSchemaInfo->getNamespaceScope(), fEmptyNamespaceURI, true, fGrammarPoolMemoryManager);
        IC_Selector* icSelector = new (fGrammarPoolMemoryManager) IC_Selector(sXPath, ic);
        ic->setSelector(icSelector);
    }
    catch (const XPathException& e) {

        reportSchemaError(elem, e);
        return false;
    }

    // ------------------------------------------------------------------
    // Get fields
    // ------------------------------------------------------------------
    elem = XUtil::getNextSiblingElement(elem);

    if (elem == 0) {

        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    while (elem != 0) {

        if (!XMLString::equals(elem->getLocalName(), SchemaSymbols::fgELT_FIELD)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        }
        else {
            // General Attribute Checking
            fAttributeCheck.checkAttributes(
                elem, GeneralAttributeCheck::E_Field, this, false, fNonXSAttList
            );
            if (checkContent(icElem, XUtil::getFirstChildElement(elem), true) != 0)
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);
            if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
            {
                fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
            }
            if (fAnnotation)
            {
                if (janAnnot.isDataNull())
                    janAnnot.reset(fAnnotation);
                else
                    janAnnot.get()->setNext(fAnnotation);
            }

            // xpath expression parsing
            xpathExpr = getElementAttValue(elem, SchemaSymbols::fgATT_XPATH);

            if (!xpathExpr || !*xpathExpr) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_XPathExprMissing);
                return false;
            }

            try {

                XercesXPath* fieldXPath = new (fGrammarPoolMemoryManager) XercesXPath
                (
                    xpathExpr
                    , fStringPool
                    , fSchemaInfo->getNamespaceScope()
                    , fEmptyNamespaceURI
                    , false
                    , fGrammarPoolMemoryManager
                );
                IC_Field* icField = new (fGrammarPoolMemoryManager) IC_Field(fieldXPath, ic);
                ic->addField(icField);
            }
            catch (const XPathException& e) {

                reportSchemaError(elem, e);
                return false;
            }
        }

        elem = XUtil::getNextSiblingElement(elem);
    }

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(ic, janAnnot.release());

    if (ic->getFieldCount() == 0) {
        return false;
    }

    return true;
}